

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

void Gia_IsoSimulate(Gia_IsoMan_t *p,int Iter)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Gia_Man_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  uint *puVar23;
  long lVar24;
  uint uVar17;
  
  pGVar5 = p->pGia;
  pGVar6 = pGVar5->pObjs;
  pGVar6->Value = pGVar6->Value + 0x1b47586d;
  pVVar7 = pGVar5->vCis;
  uVar2 = pVVar7->nSize;
  uVar14 = pGVar5->nRegs;
  uVar15 = (ulong)uVar14;
  uVar10 = uVar2 - uVar14;
  uVar19 = (ulong)uVar10;
  if (uVar10 != 0 && (int)uVar14 <= (int)uVar2) {
    uVar21 = 0;
    uVar13 = 0;
    if (0 < (int)uVar2) {
      uVar13 = (ulong)uVar2;
    }
    do {
      if (uVar13 == uVar21) goto LAB_006f5b00;
      iVar11 = pVVar7->pArray[uVar21];
      if (((long)iVar11 < 0) || (pGVar5->nObjs <= iVar11)) goto LAB_006f5ae1;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      pGVar6[iVar11].Value = pGVar6[iVar11].Value + 0xfbea205c;
      uVar21 = uVar21 + 1;
    } while (uVar19 != uVar21);
  }
  if ((Iter == 0) && (uVar13 = uVar15, 0 < (int)uVar14)) {
    do {
      if (((int)uVar19 < 0) || ((int)uVar2 <= (int)uVar19)) goto LAB_006f5b00;
      iVar11 = pVVar7->pArray[uVar19];
      if (((long)iVar11 < 0) || (pGVar5->nObjs <= iVar11)) goto LAB_006f5ae1;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      pGVar6[iVar11].Value = pGVar6[iVar11].Value + 0x22924fcd;
      uVar19 = uVar19 + 1;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  uVar3 = pGVar5->nObjs;
  uVar19 = (ulong)uVar3;
  if ((0 < (int)uVar3) && (pGVar6 != (Gia_Obj_t *)0x0)) {
    puVar23 = &pGVar6->Value;
    lVar24 = 0;
    do {
      uVar13 = *(ulong *)(puVar23 + -2);
      if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar13) {
        lVar20 = (long)((ulong)((uint)uVar13 & 0x1fffffff) * -0x100000000 + lVar24) >> 0x20;
        if (Iter == 0) {
          uVar12 = p->pLevels[lVar20];
          if ((int)uVar12 < 0) goto LAB_006f5b1f;
LAB_006f58e5:
          iVar11 = (uVar12 + 1) * s_256Primes[((uint)(uVar13 >> 0x1d) & 1) + (uVar12 & 0x7f) * 2];
        }
        else {
          uVar12 = p->pUniques[lVar20];
          if (0 < (int)uVar12) goto LAB_006f58e5;
          iVar11 = 0;
        }
        uVar12 = iVar11 + *(int *)((long)puVar23 +
                                  (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3) + *puVar23;
        uVar17 = (uint)(uVar13 >> 0x20);
        uVar16 = uVar17 & 0x1fffffff;
        lVar20 = (long)((ulong)uVar16 * -0x100000000 + lVar24) >> 0x20;
        *puVar23 = uVar12;
        if (Iter == 0) {
          uVar18 = p->pLevels[lVar20];
          if ((int)uVar18 < 0) goto LAB_006f5b1f;
LAB_006f5972:
          iVar11 = (uVar18 + 1) * s_256Primes[(uVar17 >> 0x1d & 1) + (uVar18 & 0x7f) * 2];
        }
        else {
          uVar18 = p->pUniques[lVar20];
          if (0 < (int)uVar18) goto LAB_006f5972;
          iVar11 = 0;
        }
        *puVar23 = *(int *)((long)puVar23 + (ulong)(uVar16 * 4) * -3) + uVar12 + iVar11;
      }
      lVar24 = lVar24 + 0x100000000;
      puVar23 = puVar23 + 3;
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
  }
  pVVar8 = pGVar5->vCos;
  iVar11 = pVVar8->nSize;
  if (0 < (long)iVar11) {
    piVar9 = pVVar8->pArray;
    lVar24 = 0;
    do {
      iVar22 = piVar9[lVar24];
      if (((long)iVar22 < 0) || ((int)uVar3 <= iVar22)) goto LAB_006f5ae1;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar6 + iVar22;
      uVar12 = (uint)*(undefined8 *)pGVar1 & 0x1fffffff;
      iVar22 = iVar22 - uVar12;
      if (Iter == 0) {
        uVar16 = p->pLevels[iVar22];
        if ((int)uVar16 < 0) {
LAB_006f5b1f:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
LAB_006f5a34:
        iVar22 = (uVar16 + 1) *
                 s_256Primes[((uint)*(undefined8 *)pGVar1 >> 0x1d & 1) + (uVar16 & 0x7f) * 2];
      }
      else {
        uVar16 = p->pUniques[iVar22];
        if (0 < (int)uVar16) goto LAB_006f5a34;
        iVar22 = 0;
      }
      pGVar1->Value = pGVar1->Value + iVar22 + pGVar1[-(ulong)uVar12].Value;
      lVar24 = lVar24 + 1;
    } while (iVar11 != lVar24);
  }
  if (0 < (int)uVar14) {
    uVar14 = iVar11 - uVar14;
    uVar12 = uVar10;
LAB_006f5a75:
    if (((int)uVar14 < 0) || (iVar11 <= (int)uVar14)) {
LAB_006f5b00:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar22 = pVVar8->pArray[uVar14];
    if (((long)iVar22 < 0) || ((int)uVar3 <= iVar22)) {
LAB_006f5ae1:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (pGVar6 != (Gia_Obj_t *)0x0) {
      if (((int)uVar10 < 0) || ((int)uVar2 <= (int)uVar12)) goto LAB_006f5b00;
      iVar4 = pVVar7->pArray[uVar12];
      if (((long)iVar4 < 0) || ((int)uVar3 <= iVar4)) goto LAB_006f5ae1;
      pGVar6[iVar4].Value = pGVar6[iVar4].Value + pGVar6[iVar22].Value;
      uVar12 = uVar12 + 1;
      uVar14 = uVar14 + 1;
      uVar15 = uVar15 - 1;
      if (uVar15 != 0) goto LAB_006f5a75;
    }
  }
  return;
}

Assistant:

void Gia_IsoSimulate( Gia_IsoMan_t * p, int Iter )
{
    Gia_Obj_t * pObj, * pObjF;
    int i, iObj;
    // initialize constant, inputs, and flops in the first frame
    Gia_ManConst0(p->pGia)->Value += s_256Primes[ISO_MASK];
    Gia_ManForEachPi( p->pGia, pObj, i )
        pObj->Value += s_256Primes[ISO_MASK-1];
    if ( Iter == 0 )
        Gia_ManForEachRo( p->pGia, pObj, i )
            pObj->Value += s_256Primes[ISO_MASK-2];
    // simulate nodes
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        pObj->Value += Gia_ObjFanin0(pObj)->Value + Gia_IsoUpdate(p, Iter, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj));
        pObj->Value += Gia_ObjFanin1(pObj)->Value + Gia_IsoUpdate(p, Iter, Gia_ObjFaninId1(pObj, i), Gia_ObjFaninC1(pObj));
    }
    // simulate COs
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj = Gia_ObjId(p->pGia, pObj);
        pObj->Value += Gia_ObjFanin0(pObj)->Value + Gia_IsoUpdate(p, Iter, Gia_ObjFaninId0(pObj, iObj), Gia_ObjFaninC0(pObj));
    }
    // transfer flop values
    Gia_ManForEachRiRo( p->pGia, pObjF, pObj, i )
        pObj->Value += pObjF->Value;
}